

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O2

FieldBase * __thiscall ki::dml::Record::get_field(Record *this,string *name)

{
  bool bVar1;
  mapped_type *ppFVar2;
  mapped_type pFVar3;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  bVar1 = has_field(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    ppFVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
              ::at(&this->m_field_map,name);
    pFVar3 = *ppFVar2;
  }
  else {
    pFVar3 = (FieldBase *)0x0;
  }
  return pFVar3;
}

Assistant:

const FieldBase *Record::get_field(std::string name) const
	{
		if (has_field(name))
			return m_field_map.at(name);
		return nullptr;
	}